

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512bw_blend_popcnt_unroll8(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  
  uVar2 = (ulong)(len >> 5);
  if (len < 0x100) {
    uVar5 = 0;
  }
  else {
    auVar19 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar4 = 0;
    uVar3 = 8;
    do {
      uVar5 = uVar3;
      auVar21 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x20));
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20));
      auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x60));
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x40));
      auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0xa0));
      auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x80));
      auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0xe0));
      auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0xc0));
      lVar6 = 0x20;
      auVar18 = vpsllw_avx512bw(auVar21,8);
      auVar21 = vpsrlw_avx512bw(auVar21,8);
      auVar18 = vpternlogd_avx512f(auVar18,auVar19,auVar22,0xf8);
      auVar21 = vpternlogd_avx512f(auVar21,auVar20,auVar22,0xf8);
      auVar22 = vpsllw_avx512bw(auVar23,8);
      auVar23 = vpsrlw_avx512bw(auVar23,8);
      auVar22 = vpternlogd_avx512f(auVar22,auVar19,auVar24,0xf8);
      auVar23 = vpternlogd_avx512f(auVar23,auVar20,auVar24,0xf8);
      auVar24 = vpsllw_avx512bw(auVar25,8);
      auVar25 = vpsrlw_avx512bw(auVar25,8);
      auVar24 = vpternlogd_avx512f(auVar24,auVar19,auVar15,0xf8);
      auVar25 = vpternlogd_avx512f(auVar25,auVar20,auVar15,0xf8);
      auVar15 = vpsllw_avx512bw(auVar16,8);
      auVar16 = vpsrlw_avx512bw(auVar16,8);
      auVar15 = vpternlogd_avx512f(auVar15,auVar19,auVar17,0xf8);
      auVar16 = vpternlogd_avx512f(auVar16,auVar20,auVar17,0xf8);
      do {
        uVar11 = vpmovb2m_avx512bw(auVar18);
        auVar18 = vpaddb_avx512bw(auVar18,auVar18);
        uVar12 = vpmovb2m_avx512bw(auVar21);
        auVar21 = vpaddb_avx512bw(auVar21,auVar21);
        uVar13 = vpmovb2m_avx512bw(auVar22);
        auVar22 = vpaddb_avx512bw(auVar22,auVar22);
        uVar14 = vpmovb2m_avx512bw(auVar23);
        auVar23 = vpaddb_avx512bw(auVar23,auVar23);
        uVar7 = vpmovb2m_avx512bw(auVar24);
        auVar24 = vpaddb_avx512bw(auVar24,auVar24);
        uVar8 = vpmovb2m_avx512bw(auVar25);
        auVar25 = vpaddb_avx512bw(auVar25,auVar25);
        uVar9 = vpmovb2m_avx512bw(auVar15);
        auVar15 = vpaddb_avx512bw(auVar15,auVar15);
        uVar10 = vpmovb2m_avx512bw(auVar16);
        auVar16 = vpaddb_avx512bw(auVar16,auVar16);
        *(int *)((long)flags + lVar6 + -4) =
             (int)POPCOUNT(uVar9) + (int)POPCOUNT(uVar7) + (int)POPCOUNT(uVar13) +
             (int)POPCOUNT(uVar11) + *(int *)((long)flags + lVar6 + -4);
        *(int *)((long)flags + lVar6 + 0x1c) =
             (int)POPCOUNT(uVar10) + (int)POPCOUNT(uVar8) + (int)POPCOUNT(uVar14) +
             (int)POPCOUNT(uVar12) + *(int *)((long)flags + lVar6 + 0x1c);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 8;
    } while (uVar5 + 8 <= uVar2);
  }
  if ((uVar5 | 4) <= uVar2) {
    auVar19 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar4 = uVar5;
    uVar3 = uVar5 | 4;
    do {
      uVar5 = uVar3;
      auVar21 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x20));
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20));
      auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x60));
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x40));
      lVar6 = 0x20;
      auVar25 = vpsllw_avx512bw(auVar21,8);
      auVar21 = vpsrlw_avx512bw(auVar21,8);
      auVar25 = vpternlogd_avx512f(auVar25,auVar19,auVar22,0xf8);
      auVar21 = vpternlogd_avx512f(auVar21,auVar20,auVar22,0xf8);
      auVar22 = vpsllw_avx512bw(auVar23,8);
      auVar23 = vpsrlw_avx512bw(auVar23,8);
      auVar22 = vpternlogd_avx512f(auVar22,auVar19,auVar24,0xf8);
      auVar23 = vpternlogd_avx512f(auVar23,auVar20,auVar24,0xf8);
      do {
        uVar11 = vpmovb2m_avx512bw(auVar25);
        auVar25 = vpaddb_avx512bw(auVar25,auVar25);
        uVar12 = vpmovb2m_avx512bw(auVar21);
        auVar21 = vpaddb_avx512bw(auVar21,auVar21);
        uVar13 = vpmovb2m_avx512bw(auVar22);
        auVar22 = vpaddb_avx512bw(auVar22,auVar22);
        uVar14 = vpmovb2m_avx512bw(auVar23);
        auVar23 = vpaddb_avx512bw(auVar23,auVar23);
        *(int *)((long)flags + lVar6 + -4) =
             (int)POPCOUNT(uVar13) + (int)POPCOUNT(uVar11) + *(int *)((long)flags + lVar6 + -4);
        *(int *)((long)flags + lVar6 + 0x1c) =
             (int)POPCOUNT(uVar14) + (int)POPCOUNT(uVar12) + *(int *)((long)flags + lVar6 + 0x1c);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 4;
    } while (uVar5 + 4 <= uVar2);
  }
  if (uVar5 + 2 <= uVar2) {
    auVar19 = vpbroadcastd_avx512f(ZEXT416(0xff00ff));
    auVar20 = vpbroadcastd_avx512f(ZEXT416(0xff00ff00));
    uVar4 = uVar5;
    uVar3 = uVar5 + 2;
    do {
      uVar5 = uVar3;
      auVar21 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20 + 0x20));
      auVar22 = vmovdqu64_avx512f(*(undefined1 (*) [64])(data + uVar4 * 0x20));
      lVar6 = 0x20;
      auVar23 = vpsllw_avx512bw(auVar21,8);
      auVar21 = vpsrlw_avx512bw(auVar21,8);
      auVar23 = vpternlogd_avx512f(auVar23,auVar22,auVar19,0xf8);
      auVar21 = vpternlogd_avx512f(auVar21,auVar22,auVar20,0xf8);
      do {
        uVar11 = vpmovb2m_avx512bw(auVar23);
        auVar23 = vpaddb_avx512bw(auVar23,auVar23);
        uVar12 = vpmovb2m_avx512bw(auVar21);
        auVar21 = vpaddb_avx512bw(auVar21,auVar21);
        piVar1 = (int *)((long)flags + lVar6 + -4);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar11);
        piVar1 = (int *)((long)flags + lVar6 + 0x1c);
        *piVar1 = *piVar1 + (int)POPCOUNT(uVar12);
        lVar6 = lVar6 + -4;
      } while (lVar6 != 0);
      uVar4 = uVar5;
      uVar3 = uVar5 + 2;
    } while (uVar5 + 2 <= uVar2);
  }
  uVar5 = uVar5 << 5;
  if (uVar5 < len) {
    auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar20 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar21 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar5 = uVar5 + 1;
      auVar22 = vpbroadcastd_avx512f();
      auVar22 = vpsrlvd_avx512f(auVar22,auVar20);
      auVar22 = vpandd_avx512f(auVar22,auVar21);
      auVar19 = vpaddd_avx512f(auVar22,auVar19);
    } while (len != uVar5);
    auVar19 = vmovdqu64_avx512f(auVar19);
    *(undefined1 (*) [64])flags = auVar19;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_blend_popcnt_unroll8(const uint16_t* data, uint32_t len, uint32_t* flags) { 
    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m512i v##p = _mm512_loadu_si512(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 

#define U0(p,k) __m512i input##p = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16(0x00FF), _mm512_slli_epi16(v##k, 8), AND_OR);
#define U1(p,k) __m512i input##k = _mm512_ternarylogic_epi32(v##p, _mm512_set1_epi16((int16_t)0xFF00), _mm512_srli_epi16(v##k, 8), AND_OR);
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u64(_mm512_movepi8_mask(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4,5) A(6, 7)

#define P0(p) input##p = _mm512_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3) P(4,5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A(2, 3)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 32;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((data[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}